

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  Mat *this_00;
  uint _h;
  size_t sVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  unsigned_short uVar5;
  uint _w;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  void *pvVar16;
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  long lVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  unsigned_short *puVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  void *local_1f0;
  ulong local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_170;
  Mat local_160;
  undefined8 local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  uint local_f4;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  Mat *local_a0;
  long local_98;
  void *local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  _h = (this->super_InnerProduct).num_output;
  _w = (this->super_InnerProduct).weight_data_size / (int)_h;
  local_a0 = &(this->super_InnerProduct).weight_data;
  this_00 = &this->weight_data_tm;
  if (opt->use_packing_layout == true) {
    if ((_h & 0xf) == 0) {
      Mat::reshape(&local_160,local_a0,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 4,0x20,0x10,(Allocator *)0x0);
      if (0xf < (int)_h) {
        local_f4 = _w & 0xfffffff0;
        lVar9 = 1;
        lVar15 = 2;
        lVar21 = 3;
        lVar23 = 4;
        lVar24 = 5;
        lVar25 = 6;
        lVar19 = 7;
        local_a8 = 8;
        local_b0 = 9;
        local_b8 = 10;
        local_c0 = 0xb;
        local_c8 = 0xc;
        local_d0 = 0xd;
        local_d8 = 0xe;
        local_e0 = 0xf;
        local_e8 = 0;
        uVar28 = 0;
        do {
          lVar30 = (long)(this->weight_data_tm).w;
          pvVar3 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          lVar31 = (long)local_160.w;
          if ((int)_w < 0x10) {
            lVar26 = (uVar28 >> 4) * lVar30 * sVar1;
            lVar31 = local_160.elemsize * lVar31;
            lVar27 = (uVar28 | 1) * lVar31;
            lVar10 = (uVar28 | 2) * lVar31;
            local_198 = (uVar28 | 3) * lVar31;
            local_1c0 = (uVar28 | 4) * lVar31;
            local_1a8 = (uVar28 | 5) * lVar31;
            local_1a0 = (uVar28 | 6) * lVar31;
            local_1b0 = (uVar28 | 7) * lVar31;
            local_1b8 = (uVar28 | 8) * lVar31;
            local_170 = (uVar28 | 9) * lVar31;
            lVar11 = (uVar28 | 10) * lVar31;
            lVar12 = (uVar28 | 0xb) * lVar31;
            local_188 = (uVar28 | 0xc) * lVar31;
            local_190 = (uVar28 | 0xd) * lVar31;
            lVar13 = (uVar28 | 0xe) * lVar31;
            lVar20 = lVar31 * (uVar28 | 0xf);
            lVar30 = lVar31 * uVar28;
            uVar7 = 0;
          }
          else {
            local_98 = sVar1 * local_e8 * lVar30;
            local_f0 = local_160.elemsize * uVar28 * lVar31;
            lVar27 = local_160.elemsize * lVar9 * lVar31;
            lVar10 = local_160.elemsize * lVar15 * lVar31;
            local_198 = local_160.elemsize * lVar21 * lVar31;
            local_1c0 = local_160.elemsize * lVar23 * lVar31;
            local_1a8 = local_160.elemsize * lVar24 * lVar31;
            local_1a0 = local_160.elemsize * lVar25 * lVar31;
            local_1b0 = local_160.elemsize * lVar19 * lVar31;
            local_1b8 = local_160.elemsize * local_a8 * lVar31;
            local_170 = local_160.elemsize * local_b0 * lVar31;
            lVar11 = local_160.elemsize * local_b8 * lVar31;
            lVar12 = local_160.elemsize * local_c0 * lVar31;
            local_188 = local_160.elemsize * local_c8 * lVar31;
            local_190 = local_160.elemsize * local_d0 * lVar31;
            lVar13 = local_160.elemsize * local_d8 * lVar31;
            lVar31 = local_160.elemsize * local_e0 * lVar31;
            local_100 = (void *)((long)local_160.data + local_f0);
            local_108 = (void *)((long)local_160.data + lVar27);
            local_110 = (void *)((long)local_160.data + lVar10);
            local_118 = (void *)((long)local_160.data + local_198);
            local_38 = (void *)((long)local_160.data + local_1c0);
            local_40 = (void *)((long)local_160.data + local_1a8);
            local_48 = (void *)((long)local_160.data + local_1a0);
            local_90 = local_160.data;
            iVar14 = 0xf;
            lVar26 = 0;
            lVar20 = 0;
            do {
              auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_100 + lVar20),3);
              auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_108 + lVar20),3);
              auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_110 + lVar20),3);
              auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_118 + lVar20),3);
              auVar32 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_38 + lVar20),3);
              auVar33 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_40 + lVar20),3);
              auVar34 = vcvtps2ph_avx512f(*(undefined1 (*) [64])((long)local_48 + lVar20),3);
              auVar51 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + local_1b0),3);
              auVar35 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + local_1b8),3);
              auVar36 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + local_170),3);
              auVar37 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + lVar11),3);
              auVar38 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + lVar12),3);
              auVar39 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + local_188),3);
              auVar40 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + local_190),3);
              auVar41 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + lVar13),3);
              auVar42 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar20 + lVar31),3);
              auVar43 = vpunpcklwd_avx512vl(auVar47,auVar48);
              auVar47 = vpunpckhwd_avx2(auVar47,auVar48);
              auVar52 = vpunpcklwd_avx2(auVar49,auVar50);
              auVar48 = vpunpckhwd_avx2(auVar49,auVar50);
              auVar53 = vpunpcklwd_avx2(auVar32,auVar33);
              auVar49 = vpunpckhwd_avx2(auVar32,auVar33);
              auVar54 = vpunpcklwd_avx2(auVar34,auVar51);
              auVar50 = vpunpckhwd_avx2(auVar34,auVar51);
              auVar66 = vpunpcklwd_avx2(auVar35,auVar36);
              auVar32 = vpunpckhwd_avx2(auVar35,auVar36);
              auVar35 = vpunpcklwd_avx2(auVar37,auVar38);
              auVar33 = vpunpckhwd_avx2(auVar37,auVar38);
              auVar36 = vpunpcklwd_avx2(auVar39,auVar40);
              auVar34 = vpunpckhwd_avx2(auVar39,auVar40);
              auVar37 = vpunpcklwd_avx2(auVar41,auVar42);
              auVar51 = vpunpckhwd_avx2(auVar41,auVar42);
              auVar38 = vpunpckldq_avx512vl(auVar43,auVar52);
              auVar39 = vpunpckhdq_avx512vl(auVar43,auVar52);
              auVar40 = vpunpckldq_avx512vl(auVar47,auVar48);
              auVar47 = vpunpckhdq_avx2(auVar47,auVar48);
              auVar52 = vpunpckldq_avx2(auVar53,auVar54);
              auVar48 = vpunpckhdq_avx2(auVar53,auVar54);
              auVar53 = vpunpckldq_avx2(auVar49,auVar50);
              auVar49 = vpunpckhdq_avx2(auVar49,auVar50);
              auVar54 = vpunpckldq_avx2(auVar66,auVar35);
              auVar50 = vpunpckhdq_avx2(auVar66,auVar35);
              auVar66 = vpunpckldq_avx2(auVar32,auVar33);
              auVar32 = vpunpckhdq_avx2(auVar32,auVar33);
              auVar35 = vpunpckldq_avx2(auVar36,auVar37);
              auVar33 = vpunpckhdq_avx2(auVar36,auVar37);
              auVar36 = vpunpckldq_avx2(auVar34,auVar51);
              auVar34 = vpunpckhdq_avx2(auVar34,auVar51);
              auVar37 = vpunpcklqdq_avx2(auVar38,auVar52);
              auVar51 = vpunpckhqdq_avx2(auVar38,auVar52);
              auVar52 = vpunpcklqdq_avx2(auVar39,auVar48);
              auVar48 = vpunpckhqdq_avx2(auVar39,auVar48);
              auVar38 = vpunpcklqdq_avx512vl(auVar40,auVar53);
              auVar39 = vpunpckhqdq_avx512vl(auVar40,auVar53);
              auVar40 = vpunpcklqdq_avx512vl(auVar47,auVar49);
              auVar47 = vpunpckhqdq_avx2(auVar47,auVar49);
              auVar53 = vpunpcklqdq_avx2(auVar54,auVar35);
              auVar49 = vpunpckhqdq_avx2(auVar54,auVar35);
              auVar54 = vpunpcklqdq_avx2(auVar50,auVar33);
              auVar50 = vpunpckhqdq_avx2(auVar50,auVar33);
              auVar35 = vpunpcklqdq_avx2(auVar66,auVar36);
              auVar33 = vpunpckhqdq_avx2(auVar66,auVar36);
              auVar66 = vpunpcklqdq_avx2(auVar32,auVar34);
              auVar32 = vpunpckhqdq_avx2(auVar32,auVar34);
              auVar69._0_16_ = ZEXT116(0) * auVar53._0_16_ + ZEXT116(1) * auVar37._0_16_;
              auVar69._16_16_ = ZEXT116(0) * auVar37._16_16_ + ZEXT116(1) * auVar53._0_16_;
              auVar36 = vinserti32x4_avx512vl(auVar51,auVar49._0_16_,1);
              auVar41 = vinserti32x4_avx512vl(auVar52,auVar54._0_16_,1);
              auVar42 = vinserti32x4_avx512vl(auVar48,auVar50._0_16_,1);
              auVar43 = vinserti32x4_avx512vl(auVar38,auVar35._0_16_,1);
              auVar44 = vinserti32x4_avx512vl(auVar39,auVar33._0_16_,1);
              auVar45 = vinserti32x4_avx512vl(auVar40,auVar66._0_16_,1);
              auVar46 = vinserti32x4_avx512vl(auVar47,auVar32._0_16_,1);
              auVar34 = vperm2i128_avx2(auVar37,auVar53,0x31);
              auVar49 = vperm2i128_avx2(auVar51,auVar49,0x31);
              auVar51 = vperm2i128_avx2(auVar52,auVar54,0x31);
              auVar48 = vperm2i128_avx2(auVar48,auVar50,0x31);
              auVar50 = vperm2i128_avx2(auVar38,auVar35,0x31);
              auVar33 = vperm2i128_avx2(auVar39,auVar33,0x31);
              auVar52 = vshufi64x2_avx512vl(auVar40,auVar66,3);
              auVar32 = vperm2i128_avx2(auVar47,auVar32,0x31);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98) = auVar69;
              auVar47 = vmovdqu64_avx512vl(auVar36);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x20) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar41);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x40) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar42);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x60) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar43);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x80) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar44);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0xa0) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar45);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0xc0) = auVar47;
              auVar47 = vmovdqu64_avx512vl(auVar46);
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0xe0) = auVar47;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x100) = auVar34;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x120) = auVar49;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x140) = auVar51;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x160) = auVar48;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x180) = auVar50;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x1a0) = auVar33;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x1c0) = auVar52;
              *(undefined1 (*) [32])((long)pvVar3 + lVar20 * 8 + local_98 + 0x1e0) = auVar32;
              lVar20 = lVar20 + 0x40;
              lVar26 = lVar26 + 0x200;
              iVar14 = iVar14 + 0x10;
            } while (iVar14 < (int)_w);
            lVar26 = local_98 + lVar26;
            lVar30 = local_f0 + lVar20;
            lVar27 = lVar27 + lVar20;
            lVar10 = lVar10 + lVar20;
            local_198 = local_198 + lVar20;
            local_1c0 = local_1c0 + lVar20;
            local_1a8 = local_1a8 + lVar20;
            local_1a0 = local_1a0 + lVar20;
            local_1b0 = local_1b0 + lVar20;
            local_1b8 = local_1b8 + lVar20;
            local_170 = local_170 + lVar20;
            lVar11 = lVar11 + lVar20;
            lVar12 = lVar12 + lVar20;
            local_188 = local_188 + lVar20;
            local_190 = local_190 + lVar20;
            lVar13 = lVar13 + lVar20;
            lVar20 = lVar31 + lVar20;
            uVar7 = local_f4;
          }
          lVar26 = (long)pvVar3 + lVar26;
          local_188 = (long)local_160.data + local_188;
          local_190 = (long)local_160.data + local_190;
          local_1a0 = (long)local_160.data + local_1a0;
          local_1a8 = (long)local_160.data + local_1a8;
          local_1b8 = (long)local_160.data + local_1b8;
          local_1d8 = (void *)((long)local_160.data + lVar13);
          local_1c0 = (long)local_160.data + local_1c0;
          local_1d0 = (void *)((long)local_160.data + lVar20);
          local_1e0 = (void *)((long)local_160.data + lVar11);
          local_1e8 = (long)local_160.data + lVar10;
          local_1c8 = (void *)((long)local_160.data + lVar12);
          local_170 = (long)local_160.data + local_170;
          local_1b0 = (long)local_160.data + local_1b0;
          lVar30 = (long)local_160.data + lVar30;
          local_1f0 = (void *)((long)local_160.data + lVar27);
          local_198 = (long)local_160.data + local_198;
          if ((int)(uVar7 | 7) < (int)_w) {
            lVar27 = 0;
            lVar31 = 0;
            uVar6 = uVar7;
            do {
              auVar55 = vcvtps2ph_f16c(*(undefined1 (*) [32])(lVar30 + lVar31),3);
              auVar56 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar31),3);
              auVar57 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1e8 + lVar31),3);
              auVar58 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_198 + lVar31),3);
              auVar59 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1c0 + lVar31),3);
              auVar61 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a8 + lVar31),3);
              auVar63 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1a0 + lVar31),3);
              auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b0 + lVar31),3);
              auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_1b8 + lVar31),3);
              auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_170 + lVar31),3);
              auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar31),3);
              auVar67 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1c8 + lVar31),3);
              auVar68 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_188 + lVar31),3);
              auVar70 = vcvtps2ph_f16c(*(undefined1 (*) [32])(local_190 + lVar31),3);
              auVar71 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar31),3);
              auVar72 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar31),3);
              auVar47._0_16_ = ZEXT116(0) * auVar62 + ZEXT116(1) * auVar55;
              auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar62
              ;
              auVar48._0_16_ = ZEXT116(0) * auVar64 + ZEXT116(1) * auVar56;
              auVar48._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar64
              ;
              auVar49._0_16_ = ZEXT116(0) * auVar65 + ZEXT116(1) * auVar57;
              auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar65
              ;
              auVar50._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar58;
              auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67
              ;
              auVar51._0_16_ = ZEXT116(0) * auVar68 + ZEXT116(1) * auVar59;
              auVar51._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68
              ;
              auVar52._0_16_ = ZEXT116(0) * auVar70 + ZEXT116(1) * auVar61;
              auVar52._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70
              ;
              auVar53._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar63;
              auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71
              ;
              auVar54._0_16_ = ZEXT116(0) * auVar72 + ZEXT116(1) * auVar60;
              auVar54._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar72
              ;
              auVar32 = vpunpcklwd_avx2(auVar47,auVar48);
              auVar47 = vpunpckhwd_avx2(auVar47,auVar48);
              auVar33 = vpunpcklwd_avx2(auVar49,auVar50);
              auVar48 = vpunpckhwd_avx2(auVar49,auVar50);
              auVar34 = vpunpcklwd_avx2(auVar51,auVar52);
              auVar49 = vpunpckhwd_avx2(auVar51,auVar52);
              auVar51 = vpunpcklwd_avx2(auVar53,auVar54);
              auVar50 = vpunpckhwd_avx2(auVar53,auVar54);
              auVar52 = vpunpckldq_avx2(auVar32,auVar33);
              auVar32 = vpunpckhdq_avx2(auVar32,auVar33);
              auVar33 = vpunpckldq_avx2(auVar47,auVar48);
              auVar47 = vpunpckhdq_avx2(auVar47,auVar48);
              auVar53 = vpunpckldq_avx2(auVar34,auVar51);
              auVar48 = vpunpckhdq_avx2(auVar34,auVar51);
              auVar34 = vpunpckldq_avx2(auVar49,auVar50);
              auVar49 = vpunpckhdq_avx2(auVar49,auVar50);
              auVar51 = vpunpcklqdq_avx2(auVar52,auVar53);
              auVar50 = vpunpckhqdq_avx2(auVar52,auVar53);
              auVar52 = vpunpcklqdq_avx2(auVar32,auVar48);
              auVar48 = vpunpckhqdq_avx2(auVar32,auVar48);
              auVar53 = vpunpcklqdq_avx2(auVar33,auVar34);
              auVar32 = vpunpckhqdq_avx2(auVar33,auVar34);
              auVar33 = vpunpcklqdq_avx2(auVar47,auVar49);
              auVar47 = vpunpckhqdq_avx2(auVar47,auVar49);
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8) = auVar51;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0x20) = auVar50;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0x40) = auVar52;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0x60) = auVar48;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0x80) = auVar53;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0xa0) = auVar32;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0xc0) = auVar33;
              *(undefined1 (*) [32])(lVar26 + lVar31 * 8 + 0xe0) = auVar47;
              uVar7 = uVar6 + 8;
              lVar31 = lVar31 + 0x20;
              lVar27 = lVar27 + 0x100;
              iVar14 = uVar6 + 0xf;
              uVar6 = uVar7;
            } while (iVar14 < (int)_w);
            lVar26 = lVar26 + lVar27;
            lVar30 = lVar30 + lVar31;
            local_1f0 = (void *)((long)local_1f0 + lVar31);
            local_1e8 = local_1e8 + lVar31;
            local_198 = local_198 + lVar31;
            local_1c0 = local_1c0 + lVar31;
            local_1a8 = local_1a8 + lVar31;
            local_1a0 = local_1a0 + lVar31;
            local_1b0 = local_1b0 + lVar31;
            local_1b8 = local_1b8 + lVar31;
            local_170 = local_170 + lVar31;
            local_1e0 = (void *)((long)local_1e0 + lVar31);
            local_1c8 = (void *)((long)local_1c8 + lVar31);
            local_188 = local_188 + lVar31;
            local_190 = local_190 + lVar31;
            local_1d8 = (void *)((long)local_1d8 + lVar31);
            local_1d0 = (void *)((long)local_1d0 + lVar31);
          }
          iVar14 = _w - uVar7;
          local_88 = uVar28;
          local_80 = lVar19;
          local_78 = lVar25;
          local_70 = lVar24;
          local_68 = lVar23;
          local_60 = lVar21;
          local_58 = lVar15;
          local_50 = lVar9;
          if (iVar14 != 0 && (int)uVar7 <= (int)_w) {
            lVar15 = 0;
            do {
              uVar5 = float32_to_float16(*(float *)(lVar30 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1f0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 2) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1e8 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 4) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_198 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 6) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1c0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 8) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1a8 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 10) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1a0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0xc) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1b0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0xe) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_1b8 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x10) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_170 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x12) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1e0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x14) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1c8 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x16) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_188 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x18) = uVar5;
              uVar5 = float32_to_float16(*(float *)(local_190 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x1a) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1d8 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x1c) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1d0 + lVar15));
              *(unsigned_short *)(lVar26 + lVar15 * 8 + 0x1e) = uVar5;
              lVar15 = lVar15 + 4;
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          uVar28 = local_88 + 0x10;
          local_e8 = local_e8 + 1;
          lVar9 = local_50 + 0x10;
          lVar15 = local_58 + 0x10;
          lVar21 = local_60 + 0x10;
          lVar23 = local_68 + 0x10;
          lVar24 = local_70 + 0x10;
          lVar25 = local_78 + 0x10;
          lVar19 = local_80 + 0x10;
          local_a8 = local_a8 + 0x10;
          local_b0 = local_b0 + 0x10;
          local_b8 = local_b8 + 0x10;
          local_c0 = local_c0 + 0x10;
          local_c8 = local_c8 + 0x10;
          local_d0 = local_d0 + 0x10;
          local_d8 = local_d8 + 0x10;
          local_e0 = local_e0 + 0x10;
        } while ((int)((uint)uVar28 | 0xf) < (int)_h);
      }
      if (local_160.refcount == (int *)0x0) goto LAB_002b7d9e;
      LOCK();
      *local_160.refcount = *local_160.refcount + -1;
      UNLOCK();
      if (*local_160.refcount != 0) goto LAB_002b7d9e;
      if (local_160.allocator != (Allocator *)0x0) {
        (*(local_160.allocator)->_vptr_Allocator[3])();
        goto LAB_002b7d9e;
      }
    }
    else if ((_h & 7) == 0) {
      Mat::reshape(&local_160,local_a0,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 3,0x10,8,(Allocator *)0x0);
      if (7 < (int)_h) {
        local_118 = (void *)(CONCAT44(local_118._4_4_,_w) & 0xfffffffffffffff0);
        lVar21 = 7;
        lVar15 = 6;
        lVar23 = 5;
        lVar24 = 4;
        lVar25 = 3;
        lVar9 = 2;
        lVar19 = 1;
        local_1b8 = 0;
        local_1e8 = 0;
        do {
          lVar31 = (long)(this->weight_data_tm).w;
          pvVar3 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          lVar30 = (long)local_160.w;
          if ((int)_w < 0x10) {
            puVar29 = (unsigned_short *)((long)pvVar3 + (local_1e8 >> 3) * lVar31 * sVar1);
            lVar30 = local_160.elemsize * lVar30;
            pvVar16 = (void *)(lVar30 * local_1e8 + (long)local_160.data);
            pvVar22 = (void *)((local_1e8 | 1) * lVar30 + (long)local_160.data);
            local_1e0 = (void *)((local_1e8 | 2) * lVar30 + (long)local_160.data);
            local_1c8 = (void *)((local_1e8 | 3) * lVar30 + (long)local_160.data);
            local_1d0 = (void *)((local_1e8 | 4) * lVar30 + (long)local_160.data);
            local_1d8 = (void *)((local_1e8 | 5) * lVar30 + (long)local_160.data);
            local_1f0 = (void *)((local_1e8 | 6) * lVar30 + (long)local_160.data);
            pvVar8 = (void *)(lVar30 * (local_1e8 | 7) + (long)local_160.data);
            uVar7 = 0;
          }
          else {
            local_110 = (void *)(local_160.elemsize * lVar21 * lVar30);
            lVar20 = local_160.elemsize * lVar15 * lVar30;
            lVar27 = local_160.elemsize * lVar23 * lVar30;
            lVar10 = local_160.elemsize * lVar24 * lVar30;
            lVar11 = local_160.elemsize * lVar25 * lVar30;
            lVar12 = local_160.elemsize * lVar9 * lVar30;
            lVar13 = local_160.elemsize * lVar19 * lVar30;
            lVar30 = local_160.elemsize * local_1e8 * lVar30;
            local_108 = (void *)(sVar1 * local_1b8 * lVar31);
            local_100 = local_160.data;
            iVar14 = 0xf;
            lVar26 = 0;
            lVar31 = 0;
            do {
              auVar47 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar30),3);
              auVar48 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar13),3);
              auVar49 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar12),3);
              auVar50 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar11),3);
              auVar51 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar10),3);
              auVar52 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar27),3);
              auVar53 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)local_160.data + lVar31 + lVar20),3);
              auVar54 = vcvtps2ph_avx512f(*(undefined1 (*) [64])
                                           ((long)((long)local_160.data + (long)local_110) + lVar31)
                                          ,3);
              auVar32 = vpunpcklwd_avx2(auVar47,auVar48);
              auVar47 = vpunpckhwd_avx2(auVar47,auVar48);
              auVar33 = vpunpcklwd_avx2(auVar49,auVar50);
              auVar48 = vpunpckhwd_avx2(auVar49,auVar50);
              auVar34 = vpunpcklwd_avx2(auVar51,auVar52);
              auVar49 = vpunpckhwd_avx2(auVar51,auVar52);
              auVar51 = vpunpcklwd_avx2(auVar53,auVar54);
              auVar50 = vpunpckhwd_avx2(auVar53,auVar54);
              auVar52 = vpunpckldq_avx2(auVar32,auVar33);
              auVar32 = vpunpckhdq_avx2(auVar32,auVar33);
              auVar33 = vpunpckldq_avx2(auVar47,auVar48);
              auVar47 = vpunpckhdq_avx2(auVar47,auVar48);
              auVar53 = vpunpckldq_avx2(auVar34,auVar51);
              auVar48 = vpunpckhdq_avx2(auVar34,auVar51);
              auVar34 = vpunpckldq_avx2(auVar49,auVar50);
              auVar49 = vpunpckhdq_avx2(auVar49,auVar50);
              auVar51 = vpunpcklqdq_avx2(auVar52,auVar53);
              auVar50 = vpunpckhqdq_avx2(auVar52,auVar53);
              auVar52 = vpunpcklqdq_avx2(auVar32,auVar48);
              auVar48 = vpunpckhqdq_avx2(auVar32,auVar48);
              auVar53 = vpunpcklqdq_avx2(auVar33,auVar34);
              auVar32 = vpunpckhqdq_avx2(auVar33,auVar34);
              auVar33 = vpunpcklqdq_avx2(auVar47,auVar49);
              auVar47 = vpunpckhqdq_avx2(auVar47,auVar49);
              auVar34._0_16_ = ZEXT116(0) * auVar50._0_16_ + ZEXT116(1) * auVar51._0_16_;
              auVar34._16_16_ = ZEXT116(0) * auVar51._16_16_ + ZEXT116(1) * auVar50._0_16_;
              auVar66._0_16_ = ZEXT116(0) * auVar48._0_16_ + ZEXT116(1) * auVar52._0_16_;
              auVar66._16_16_ = ZEXT116(0) * auVar52._16_16_ + ZEXT116(1) * auVar48._0_16_;
              auVar35._0_16_ = ZEXT116(0) * auVar32._0_16_ + ZEXT116(1) * auVar53._0_16_;
              auVar35._16_16_ = ZEXT116(0) * auVar53._16_16_ + ZEXT116(1) * auVar32._0_16_;
              auVar36._0_16_ = ZEXT116(0) * auVar47._0_16_ + ZEXT116(1) * auVar33._0_16_;
              auVar36._16_16_ = ZEXT116(0) * auVar33._16_16_ + ZEXT116(1) * auVar47._0_16_;
              auVar49 = vperm2i128_avx2(auVar51,auVar50,0x31);
              auVar48 = vperm2i128_avx2(auVar52,auVar48,0x31);
              auVar50 = vperm2i128_avx2(auVar53,auVar32,0x31);
              auVar47 = vperm2i128_avx2(auVar33,auVar47,0x31);
              *(undefined1 (*) [32])((long)local_108 + (long)(lVar31 * 4 + (long)pvVar3)) = auVar34;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0x20) = auVar66;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0x40) = auVar35;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0x60) = auVar36;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0x80) = auVar49;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0xa0) = auVar48;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0xc0) = auVar50;
              *(undefined1 (*) [32])((long)local_108 + (long)pvVar3 + lVar31 * 4 + 0xe0) = auVar47;
              iVar14 = iVar14 + 0x10;
              lVar31 = lVar31 + 0x40;
              lVar26 = lVar26 + 0x100;
            } while (iVar14 < (int)_w);
            lVar31 = (long)local_160.data + lVar31;
            pvVar8 = (void *)((long)local_110 + lVar31);
            local_1f0 = (void *)(lVar20 + lVar31);
            local_1d8 = (void *)(lVar27 + lVar31);
            local_1d0 = (void *)(lVar10 + lVar31);
            local_1c8 = (void *)(lVar11 + lVar31);
            local_1e0 = (void *)(lVar12 + lVar31);
            pvVar22 = (void *)(lVar13 + lVar31);
            pvVar16 = (void *)(lVar31 + lVar30);
            puVar29 = (unsigned_short *)((long)pvVar3 + lVar26 + (long)local_108);
            uVar7 = (uint)local_118;
          }
          if ((int)(uVar7 | 7) < (int)_w) {
            lVar31 = 0;
            lVar30 = 0;
            uVar6 = uVar7;
            do {
              auVar55 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar16 + lVar30),3);
              auVar56 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar22 + lVar30),3);
              auVar57 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1e0 + lVar30),3);
              auVar58 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1c8 + lVar30),3);
              auVar60 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d0 + lVar30),3);
              auVar62 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1d8 + lVar30),3);
              auVar64 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_1f0 + lVar30),3);
              auVar65 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)pvVar8 + lVar30),3);
              auVar59 = vpunpcklwd_avx(auVar55,auVar56);
              auVar55 = vpunpckhwd_avx(auVar55,auVar56);
              auVar61 = vpunpcklwd_avx(auVar57,auVar58);
              auVar56 = vpunpckhwd_avx(auVar57,auVar58);
              auVar63 = vpunpcklwd_avx(auVar60,auVar62);
              auVar57 = vpunpckhwd_avx(auVar60,auVar62);
              auVar60 = vpunpcklwd_avx(auVar64,auVar65);
              auVar58 = vpunpckhwd_avx(auVar64,auVar65);
              auVar62 = vpunpckldq_avx(auVar59,auVar61);
              auVar59 = vpunpckhdq_avx(auVar59,auVar61);
              auVar61 = vpunpckldq_avx(auVar55,auVar56);
              auVar55 = vpunpckhdq_avx(auVar55,auVar56);
              auVar64 = vpunpckldq_avx(auVar63,auVar60);
              auVar56 = vpunpckhdq_avx(auVar63,auVar60);
              auVar63 = vpunpckldq_avx(auVar57,auVar58);
              auVar57 = vpunpckhdq_avx(auVar57,auVar58);
              auVar60 = vpunpcklqdq_avx(auVar62,auVar64);
              auVar58 = vpunpckhqdq_avx(auVar62,auVar64);
              auVar62 = vpunpcklqdq_avx(auVar59,auVar56);
              auVar56 = vpunpckhqdq_avx(auVar59,auVar56);
              auVar64 = vpunpcklqdq_avx(auVar61,auVar63);
              auVar59 = vpunpckhqdq_avx(auVar61,auVar63);
              auVar61 = vpunpcklqdq_avx(auVar55,auVar57);
              auVar55 = vpunpckhqdq_avx(auVar55,auVar57);
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2) = auVar60;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 8) = auVar58;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x10) = auVar62;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x18) = auVar56;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x20) = auVar64;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x28) = auVar59;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x30) = auVar61;
              *(undefined1 (*) [16])(puVar29 + lVar30 * 2 + 0x38) = auVar55;
              uVar7 = uVar6 + 8;
              iVar14 = uVar6 + 0xf;
              lVar30 = lVar30 + 0x20;
              lVar31 = lVar31 + 0x80;
              uVar6 = uVar7;
            } while (iVar14 < (int)_w);
            pvVar8 = (void *)((long)pvVar8 + lVar30);
            local_1f0 = (void *)((long)local_1f0 + lVar30);
            local_1d8 = (void *)((long)local_1d8 + lVar30);
            local_1d0 = (void *)((long)local_1d0 + lVar30);
            local_1c8 = (void *)((long)local_1c8 + lVar30);
            local_1e0 = (void *)((long)local_1e0 + lVar30);
            pvVar22 = (void *)((long)pvVar22 + lVar30);
            pvVar16 = (void *)((long)pvVar16 + lVar30);
            puVar29 = (unsigned_short *)((long)puVar29 + lVar31);
          }
          if ((int)uVar7 < (int)_w) {
            lVar31 = 0;
            do {
              uVar5 = float32_to_float16(*(float *)((long)pvVar16 + lVar31 * 4));
              *puVar29 = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)pvVar22 + lVar31 * 4));
              puVar29[1] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1e0 + lVar31 * 4));
              puVar29[2] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1c8 + lVar31 * 4));
              puVar29[3] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1d0 + lVar31 * 4));
              puVar29[4] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1d8 + lVar31 * 4));
              puVar29[5] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)local_1f0 + lVar31 * 4));
              puVar29[6] = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)pvVar8 + lVar31 * 4));
              puVar29[7] = uVar5;
              puVar29 = puVar29 + 8;
              lVar31 = lVar31 + 1;
            } while (_w - uVar7 != (int)lVar31);
          }
          local_1e8 = local_1e8 + 8;
          lVar21 = lVar21 + 8;
          lVar15 = lVar15 + 8;
          lVar23 = lVar23 + 8;
          lVar24 = lVar24 + 8;
          lVar25 = lVar25 + 8;
          lVar9 = lVar9 + 8;
          lVar19 = lVar19 + 8;
          local_1b8 = local_1b8 + 1;
        } while ((int)((uint)local_1e8 | 7) < (int)_h);
      }
      if (local_160.refcount == (int *)0x0) goto LAB_002b7d9e;
      LOCK();
      *local_160.refcount = *local_160.refcount + -1;
      UNLOCK();
      if (*local_160.refcount != 0) goto LAB_002b7d9e;
      if (local_160.allocator != (Allocator *)0x0) {
        (*(local_160.allocator)->_vptr_Allocator[3])();
        goto LAB_002b7d9e;
      }
    }
    else {
      if ((_h & 3) != 0) goto LAB_002b6602;
      Mat::reshape(&local_160,local_a0,_w,_h,(Allocator *)0x0);
      Mat::create(this_00,_w,(int)_h >> 2,8,4,(Allocator *)0x0);
      if (3 < (int)_h) {
        local_1c0._0_4_ = _w & 0xfffffffc;
        lVar19 = 3;
        lVar21 = 2;
        lVar23 = 1;
        lVar15 = 0;
        uVar28 = 0;
        do {
          pvVar8 = local_160.data;
          lVar25 = (long)(this->weight_data_tm).w;
          pvVar3 = (this->weight_data_tm).data;
          sVar1 = (this->weight_data_tm).elemsize;
          pauVar17 = (undefined1 (*) [16])((uVar28 >> 2) * lVar25 * sVar1 + (long)pvVar3);
          lVar24 = (long)local_160.w;
          if ((int)_w < 4) {
            lVar24 = local_160.elemsize * lVar24;
            lVar27 = lVar24 * uVar28;
            lVar30 = (uVar28 | 1) * lVar24;
            lVar31 = (uVar28 | 2) * lVar24;
            lVar9 = lVar24 * (uVar28 | 3);
            uVar7 = 0;
          }
          else {
            lVar9 = local_160.elemsize * lVar19 * lVar24;
            lVar31 = local_160.elemsize * lVar21 * lVar24;
            lVar30 = local_160.elemsize * lVar23 * lVar24;
            lVar24 = local_160.elemsize * uVar28 * lVar24;
            iVar14 = 3;
            lVar27 = 0;
            do {
              pauVar18 = pauVar17;
              auVar55 = *(undefined1 (*) [16])((long)local_160.data + lVar27 + lVar24);
              auVar56 = *(undefined1 (*) [16])((long)local_160.data + lVar27 + lVar30);
              auVar57 = *(undefined1 (*) [16])((long)local_160.data + lVar27 + lVar31);
              auVar58 = *(undefined1 (*) [16])((long)local_160.data + lVar27 + lVar9);
              auVar59 = vpunpckldq_avx(auVar55,auVar56);
              auVar61 = vpunpckldq_avx(auVar57,auVar58);
              auVar55 = vpunpckhdq_avx(auVar55,auVar56);
              auVar56 = vpunpckhdq_avx(auVar57,auVar58);
              auVar58 = vpunpcklqdq_avx(auVar59,auVar61);
              auVar57 = vpunpckhqdq_avx(auVar59,auVar61);
              auVar59 = vpunpcklqdq_avx(auVar55,auVar56);
              auVar55 = vpunpckhqdq_avx(auVar55,auVar56);
              auVar33._0_16_ = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar58;
              auVar33._16_16_ = ZEXT116(1) * auVar57;
              auVar32._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar59;
              auVar32._16_16_ = ZEXT116(1) * auVar55;
              pauVar17 = (undefined1 (*) [16])((long)pvVar3 + lVar27 * 2 + sVar1 * lVar15 * lVar25);
              auVar55 = vcvtps2ph_f16c(auVar33,3);
              *pauVar17 = auVar55;
              auVar55 = vcvtps2ph_f16c(auVar32,3);
              pauVar17[1] = auVar55;
              iVar14 = iVar14 + 4;
              lVar27 = lVar27 + 0x10;
              pauVar17 = pauVar17 + 2;
            } while (iVar14 < (int)_w);
            pauVar17 = pauVar18 + 2;
            lVar9 = lVar9 + lVar27;
            lVar31 = lVar31 + lVar27;
            lVar30 = lVar30 + lVar27;
            lVar27 = lVar24 + lVar27;
            uVar7 = (uint)local_1c0;
          }
          if ((int)uVar7 < (int)_w) {
            lVar24 = 0;
            do {
              uVar5 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar27));
              *(unsigned_short *)(*pauVar17 + lVar24 * 8) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar30));
              *(unsigned_short *)(*pauVar17 + lVar24 * 8 + 2) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar31));
              *(unsigned_short *)(*pauVar17 + lVar24 * 8 + 4) = uVar5;
              uVar5 = float32_to_float16(*(float *)((long)pvVar8 + lVar24 * 4 + lVar9));
              *(unsigned_short *)(*pauVar17 + lVar24 * 8 + 6) = uVar5;
              lVar24 = lVar24 + 1;
            } while (_w - uVar7 != (int)lVar24);
          }
          uVar28 = uVar28 + 4;
          lVar19 = lVar19 + 4;
          lVar21 = lVar21 + 4;
          lVar23 = lVar23 + 4;
          lVar15 = lVar15 + 1;
        } while ((int)((uint)uVar28 | 3) < (int)_h);
      }
      if (local_160.refcount == (int *)0x0) goto LAB_002b7d9e;
      LOCK();
      *local_160.refcount = *local_160.refcount + -1;
      UNLOCK();
      if (*local_160.refcount != 0) goto LAB_002b7d9e;
      if (local_160.allocator != (Allocator *)0x0) {
        (*(local_160.allocator)->_vptr_Allocator[3])();
        goto LAB_002b7d9e;
      }
    }
  }
  else {
LAB_002b6602:
    Mat::reshape(&local_160,local_a0,_w,_h,(Allocator *)0x0);
    cast_float32_to_float16(&local_160,this_00,opt);
    if (local_160.refcount == (int *)0x0) goto LAB_002b7d9e;
    LOCK();
    *local_160.refcount = *local_160.refcount + -1;
    UNLOCK();
    if (*local_160.refcount != 0) goto LAB_002b7d9e;
    if (local_160.allocator != (Allocator *)0x0) {
      (*(local_160.allocator)->_vptr_Allocator[3])();
      goto LAB_002b7d9e;
    }
  }
  if (local_160.data != (void *)0x0) {
    free(local_160.data);
  }
LAB_002b7d9e:
  if (opt->lightmode == true) {
    piVar2 = (this->super_InnerProduct).weight_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_InnerProduct).weight_data.data;
        pAVar4 = (this->super_InnerProduct).weight_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_InnerProduct).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&local_a0->refcount + 4) = (undefined1  [16])0x0;
    local_a0->data = (void *)0x0;
    local_a0->refcount = (int *)0x0;
    (this->super_InnerProduct).weight_data.dims = 0;
    (this->super_InnerProduct).weight_data.w = 0;
    (this->super_InnerProduct).weight_data.h = 0;
    (this->super_InnerProduct).weight_data.d = 0;
    (this->super_InnerProduct).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}